

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1Parser.h
# Opt level: O1

int64_t __thiscall VC1Unit::vc1_escape_buffer(VC1Unit *this,uint8_t *dst)

{
  byte *pbVar1;
  size_t __n;
  byte *pbVar2;
  byte *__src;
  uint8_t *__dest;
  
  __src = this->m_nalBuffer;
  pbVar1 = __src + this->m_nalBufferLen;
  __dest = dst;
  if (2 < (long)this->m_nalBufferLen) {
    pbVar2 = __src + 2;
    do {
      if (*pbVar2 < 4) {
        if ((pbVar2[-2] == 0) && (pbVar2[-1] == 0)) {
          __n = (long)pbVar2 - (long)__src;
          memcpy(__dest,__src,__n);
          __dest[__n] = '\x03';
          __src = pbVar2 + 1;
          __dest[__n + 1] = *pbVar2;
          if (__src < pbVar1) {
            __src = pbVar2 + 2;
            __dest[__n + 2] = pbVar2[1];
            __dest = __dest + __n + 3;
            pbVar2 = __src;
          }
          else {
            __dest = __dest + __n + 2;
            pbVar2 = __src;
          }
        }
        else {
          pbVar2 = pbVar2 + 1;
        }
      }
      else {
        pbVar2 = pbVar2 + 3;
      }
    } while (pbVar2 < pbVar1);
  }
  memcpy(__dest,__src,(long)pbVar1 - (long)__src);
  return (int64_t)(__dest + (((long)pbVar1 - (long)__src) - (long)dst));
}

Assistant:

int64_t vc1_escape_buffer(uint8_t* dst) const
    {
        const uint8_t* srcStart = m_nalBuffer;
        const uint8_t* initDstBuffer = dst;
        const uint8_t* srcBuffer = m_nalBuffer;
        const uint8_t* srcEnd = m_nalBuffer + m_nalBufferLen;
        for (srcBuffer += 2; srcBuffer < srcEnd;)
        {
            if (*srcBuffer > 3)
                srcBuffer += 3;
            else if (srcBuffer[-2] == 0 && srcBuffer[-1] == 0)
            {
                memcpy(dst, srcStart, srcBuffer - srcStart);
                dst += srcBuffer - srcStart;
                *dst++ = 3;
                *dst++ = *srcBuffer++;
                for (int k = 0; k < 1; k++)
                    if (srcBuffer < srcEnd)
                    {
                        *dst++ = *srcBuffer++;
                    }
                srcStart = srcBuffer;
            }
            else
                srcBuffer++;
        }
        memcpy(dst, srcStart, srcEnd - srcStart);
        dst += srcEnd - srcStart;
        return dst - initDstBuffer;
    }